

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O1

Qiniu_Error
Qiniu_RS_BatchRestoreArchive
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryRestoreArchive *entries,
          Qiniu_ItemCount entryCount)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *s2;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar5;
  Qiniu_Int64 QVar6;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  Qiniu_Error QVar11;
  cJSON *root;
  char *rsHost;
  undefined8 local_58;
  Qiniu_RS_BatchItemRet *local_50;
  char *local_48;
  Qiniu_Client *local_40;
  char *local_38;
  char *pcVar7;
  
  QVar11 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_38);
  pcVar7 = QVar11.message;
  uVar1 = QVar11.code;
  if (uVar1 == 200) {
    local_50 = rets;
    local_48 = Qiniu_String_Concat2(local_38,"/batch");
    local_40 = self;
    if (entryCount < 1) {
      pcVar3 = (char *)0x0;
    }
    else {
      lVar8 = 0;
      pcVar7 = (char *)0x0;
      do {
        pcVar3 = Qiniu_String_Concat3
                           (*(char **)((long)&entries->bucket + lVar8),":",
                            *(char **)((long)&entries->key + lVar8));
        pcVar4 = Qiniu_String_Encode(pcVar3);
        local_58._0_4_ = 0;
        snprintf((char *)&local_58,4,"%d",(ulong)*(uint *)((long)&entries->deleteAfterDays + lVar8))
        ;
        s2 = Qiniu_String_Concat(pcVar4,"/freezeAfterDays/",&local_58,0);
        s3 = Qiniu_String_Concat2("op=/restoreAr/",s2);
        Qiniu_Free(pcVar3);
        Qiniu_Free(pcVar4);
        Qiniu_Free(s2);
        pcVar3 = s3;
        if (pcVar7 != (char *)0x0) {
          pcVar3 = Qiniu_String_Concat3(pcVar7,"&",s3);
          free(s3);
        }
        free(pcVar7);
        lVar8 = lVar8 + 0x18;
        pcVar7 = pcVar3;
      } while ((ulong)(uint)entryCount * 0x18 != lVar8);
    }
    bodyLen = strlen(pcVar3);
    pcVar4 = local_48;
    QVar11 = Qiniu_Client_CallWithBuffer
                       (local_40,(Qiniu_Json **)&local_58,local_48,pcVar3,bodyLen,
                        "application/x-www-form-urlencoded");
    pcVar7 = QVar11.message;
    uVar1 = QVar11.code;
    free(pcVar4);
    free(pcVar3);
    uVar2 = cJSON_GetArraySize((cJSON *)CONCAT44(local_58._4_4_,(undefined4)local_58));
    if (0 < (int)uVar2) {
      piVar10 = &local_50->code;
      uVar9 = 0;
      do {
        pcVar5 = cJSON_GetArrayItem((cJSON *)CONCAT44(local_58._4_4_,(undefined4)local_58),
                                    (int)uVar9);
        QVar6 = Qiniu_Json_GetInt64(pcVar5,"code",0);
        pcVar5 = cJSON_GetObjectItem(pcVar5,"data");
        *piVar10 = (int)QVar6;
        if ((int)QVar6 != 200) {
          pcVar3 = Qiniu_Json_GetString(pcVar5,"error",(char *)0x0);
          ((Qiniu_RS_BatchItemRet *)(piVar10 + -2))->error = pcVar3;
        }
        uVar9 = uVar9 + 1;
        piVar10 = piVar10 + 4;
      } while (uVar2 != uVar9);
    }
  }
  QVar11._4_4_ = 0;
  QVar11.code = uVar1;
  QVar11.message = pcVar7;
  return QVar11;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchRestoreArchive(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                         Qiniu_RS_EntryRestoreArchive *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryRestoreArchive *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);

        char buf[4] = {0};
        snprintf(buf, sizeof(buf), "%d", entry->deleteAfterDays);
        char *deleteAfterDaysStr = &buf[0];

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/freezeAfterDays/", deleteAfterDaysStr, NULL);
        opBody = Qiniu_String_Concat2("op=/restoreAr/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}